

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::ReleasePages
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,Recycler *recycler)

{
  char **ppcVar1;
  HeapBlockType HVar2;
  undefined4 *puVar3;
  char *__s;
  code *pcVar4;
  bool bVar5;
  IdleDecommitPageAllocator *this_00;
  undefined8 *in_FS_OFFSET;
  
  if ((recycler->collectionState).value == CollectionStateMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x19d,"(recycler->collectionState != CollectionStateMark)",
                       "recycler->collectionState != CollectionStateMark");
    if (!bVar5) goto LAB_00208a01;
    *puVar3 = 0;
  }
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x19e,"(segment != nullptr)","segment != nullptr");
    if (!bVar5) goto LAB_00208a01;
    *puVar3 = 0;
  }
  if ((this->super_HeapBlock).address == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x19f,"(address != nullptr)","address != nullptr");
    if (!bVar5) {
LAB_00208a01:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  ppcVar1 = &(this->super_HeapBlock).address;
  HVar2 = (this->super_HeapBlock).heapBlockType;
  if (((HVar2 == MediumLeafBlockType) || (HVar2 == SmallLeafBlockType)) &&
     (recycler->recyclerFlagsTable->Verbose == true)) {
    bVar5 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar5) {
      Output::Print(L"Releasing leaf block pages at address 0x%p\n",*ppcVar1);
    }
  }
  __s = (this->super_HeapBlock).address;
  memset(__s,0xfe,0x1000);
  this_00 = GetPageAllocator(this);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ReleasePages(&this_00->super_PageAllocator,__s,1,(this->super_HeapBlock).segment);
  *ppcVar1 = (char *)0x0;
  (this->super_HeapBlock).segment = (Segment *)0x0;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::ReleasePages(Recycler * recycler)
{
    Assert(recycler->collectionState != CollectionStateMark);
    Assert(segment != nullptr);
    Assert(address != nullptr);

#if DBG
    if (this->IsLeafBlock())
    {
        RecyclerVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Releasing leaf block pages at address 0x%p\n"), address);
    }
#endif

    char* address = this->address;

#ifdef RECYCLER_FREE_MEM_FILL
    memset(address, DbgMemFill, AutoSystemInfo::PageSize * (this->GetPageCount()-this->GetUnusablePageCount()));
#endif

    if (this->GetUnusablePageCount() > 0)
    {
        this->RestoreUnusablePages();
    }

    this->GetPageAllocator()->ReleasePages(address, this->GetPageCount(), this->GetPageSegment());

    this->segment = nullptr;
    this->address = nullptr;
}